

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

double duckdb::FinalizeEntropy<duckdb::ModeState<long,duckdb::ModeStandard<long>>>
                 (ModeState<long,_duckdb::ModeStandard<long>_> *state)

{
  undefined8 uVar1;
  size_t sVar2;
  bool bVar3;
  reference ppVar4;
  long in_RDI;
  double dVar5;
  _Node_iterator<std::pair<const_long,_duckdb::ModeAttr>,_false,_false> *this;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double val_sec;
  pair<const_long,_duckdb::ModeAttr> *val;
  iterator __end0;
  iterator __begin0;
  Counts *__range2;
  double entropy;
  double count;
  unordered_map<long,_duckdb::ModeAttr,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>_>
  *in_stack_ffffffffffffffa8;
  _Node_iterator_base<std::pair<const_long,_duckdb::ModeAttr>,_false> local_38;
  _Node_iterator_base<std::pair<const_long,_duckdb::ModeAttr>,_false> local_30;
  undefined8 local_28;
  double local_20;
  double local_18;
  double local_8;
  
  if (*(long *)(in_RDI + 0x18) == 0) {
    local_8 = 0.0;
  }
  else {
    uVar1 = *(undefined8 *)(in_RDI + 0x38);
    auVar6._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar6._0_8_ = uVar1;
    auVar6._12_4_ = 0x45300000;
    local_18 = (auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    local_20 = 0.0;
    local_28 = *(undefined8 *)(in_RDI + 0x18);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<long,_duckdb::ModeAttr,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>_>
         ::begin(in_stack_ffffffffffffffa8);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<long,_duckdb::ModeAttr,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>_>
         ::end(in_stack_ffffffffffffffa8);
    while( true ) {
      bVar3 = std::__detail::operator!=(&local_30,&local_38);
      if (!bVar3) break;
      ppVar4 = std::__detail::_Node_iterator<std::pair<const_long,_duckdb::ModeAttr>,_false,_false>
               ::operator*((_Node_iterator<std::pair<const_long,_duckdb::ModeAttr>,_false,_false> *)
                           0x9c87ec);
      sVar2 = (ppVar4->second).count;
      auVar7._8_4_ = (int)(sVar2 >> 0x20);
      auVar7._0_8_ = sVar2;
      auVar7._12_4_ = 0x45300000;
      dVar5 = (auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
      this = (_Node_iterator<std::pair<const_long,_duckdb::ModeAttr>,_false,_false> *)
             (dVar5 / local_18);
      dVar5 = log2(local_18 / dVar5);
      local_20 = (double)this * dVar5 + local_20;
      std::__detail::_Node_iterator<std::pair<const_long,_duckdb::ModeAttr>,_false,_false>::
      operator++(this);
    }
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

static double FinalizeEntropy(STATE &state) {
	if (!state.frequency_map) {
		return 0;
	}
	double count = static_cast<double>(state.count);
	double entropy = 0;
	for (auto &val : *state.frequency_map) {
		double val_sec = static_cast<double>(val.second.count);
		entropy += (val_sec / count) * log2(count / val_sec);
	}
	return entropy;
}